

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O0

stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *c,int width,int height)

{
  stbrp__findresult sVar1;
  int in_EDX;
  int in_ESI;
  stbrp_context *in_RDI;
  int waste_1;
  int y_1;
  int xpos;
  int waste;
  int y;
  stbrp_node **best;
  stbrp_node *tail;
  stbrp_node *node;
  stbrp_node **prev;
  int best_y;
  int best_x;
  int best_waste;
  stbrp__findresult fr;
  stbrp_coord local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  stbrp_node **local_50;
  stbrp_node *local_48;
  stbrp_node *local_40;
  stbrp_node **local_38;
  int local_2c;
  stbrp_coord local_28;
  int local_24;
  int local_20;
  int local_1c;
  stbrp_context *local_18;
  stbrp_coord local_10;
  int iStack_c;
  stbrp_node **local_8;
  
  local_24 = 0x40000000;
  local_2c = 0x40000000;
  local_50 = (stbrp_node **)0x0;
  local_1c = in_ESI + in_RDI->align + -1;
  local_1c = local_1c - local_1c % in_RDI->align;
  if ((in_RDI->width < local_1c) || (in_RDI->height < in_EDX)) {
    local_8 = (stbrp_node **)0x0;
    iStack_c = 0;
    local_10 = 0;
  }
  else {
    local_38 = &in_RDI->active_head;
    local_20 = in_EDX;
    local_18 = in_RDI;
    for (local_40 = in_RDI->active_head; local_40->x + local_1c <= local_18->width;
        local_40 = local_40->next) {
      local_54 = stbrp__skyline_find_min_y(local_18,local_40,local_40->x,local_1c,&local_58);
      if (local_18->heuristic == 0) {
        if (local_54 < local_2c) {
          local_50 = local_38;
          local_2c = local_54;
        }
      }
      else if ((local_54 + local_20 <= local_18->height) &&
              ((local_54 < local_2c || ((local_54 == local_2c && (local_58 < local_24)))))) {
        local_24 = local_58;
        local_50 = local_38;
        local_2c = local_54;
      }
      local_38 = &local_40->next;
    }
    if (local_50 == (stbrp_node **)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = (*local_50)->x;
    }
    local_28 = local_68;
    if (local_18->heuristic == 1) {
      local_40 = local_18->active_head;
      local_38 = &local_18->active_head;
      for (local_48 = local_18->active_head; local_48->x < local_1c; local_48 = local_48->next) {
      }
      for (; local_48 != (stbrp_node *)0x0; local_48 = local_48->next) {
        local_5c = local_48->x - local_1c;
        while (local_40->next->x <= local_5c) {
          local_38 = &local_40->next;
          local_40 = local_40->next;
        }
        local_60 = stbrp__skyline_find_min_y(local_18,local_40,local_5c,local_1c,&local_64);
        if (((local_60 + local_20 <= local_18->height) && (local_60 <= local_2c)) &&
           (((local_60 < local_2c || (local_64 < local_24)) ||
            ((local_64 == local_24 && (local_5c < local_28)))))) {
          local_28 = local_5c;
          local_24 = local_64;
          local_50 = local_38;
          local_2c = local_60;
        }
      }
    }
    local_8 = local_50;
    local_10 = local_28;
    iStack_c = local_2c;
  }
  sVar1.y = iStack_c;
  sVar1.x = local_10;
  sVar1.prev_link = local_8;
  return sVar1;
}

Assistant:

static stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *c, int width, int height)
{
   int best_waste = (1<<30), best_x, best_y = (1 << 30);
   stbrp__findresult fr;
   stbrp_node **prev, *node, *tail, **best = NULL;

   // align to multiple of c->align
   width = (width + c->align - 1);
   width -= width % c->align;
   STBRP_ASSERT(width % c->align == 0);

   // if it can't possibly fit, bail immediately
   if (width > c->width || height > c->height) {
      fr.prev_link = NULL;
      fr.x = fr.y = 0;
      return fr;
   }

   node = c->active_head;
   prev = &c->active_head;
   while (node->x + width <= c->width) {
      int y,waste;
      y = stbrp__skyline_find_min_y(c, node, node->x, width, &waste);
      if (c->heuristic == STBRP_HEURISTIC_Skyline_BL_sortHeight) { // actually just want to test BL
         // bottom left
         if (y < best_y) {
            best_y = y;
            best = prev;
         }
      } else {
         // best-fit
         if (y + height <= c->height) {
            // can only use it if it first vertically
            if (y < best_y || (y == best_y && waste < best_waste)) {
               best_y = y;
               best_waste = waste;
               best = prev;
            }
         }
      }
      prev = &node->next;
      node = node->next;
   }

   best_x = (best == NULL) ? 0 : (*best)->x;

   // if doing best-fit (BF), we also have to try aligning right edge to each node position
   //
   // e.g, if fitting
   //
   //     ____________________
   //    |____________________|
   //
   //            into
   //
   //   |                         |
   //   |             ____________|
   //   |____________|
   //
   // then right-aligned reduces waste, but bottom-left BL is always chooses left-aligned
   //
   // This makes BF take about 2x the time

   if (c->heuristic == STBRP_HEURISTIC_Skyline_BF_sortHeight) {
      tail = c->active_head;
      node = c->active_head;
      prev = &c->active_head;
      // find first node that's admissible
      while (tail->x < width)
         tail = tail->next;
      while (tail) {
         int xpos = tail->x - width;
         int y,waste;
         STBRP_ASSERT(xpos >= 0);
         // find the left position that matches this
         while (node->next->x <= xpos) {
            prev = &node->next;
            node = node->next;
         }
         STBRP_ASSERT(node->next->x > xpos && node->x <= xpos);
         y = stbrp__skyline_find_min_y(c, node, xpos, width, &waste);
         if (y + height <= c->height) {
            if (y <= best_y) {
               if (y < best_y || waste < best_waste || (waste==best_waste && xpos < best_x)) {
                  best_x = xpos;
                  //STBRP_ASSERT(y <= best_y); [DEAR IMGUI]
                  best_y = y;
                  best_waste = waste;
                  best = prev;
               }
            }
         }
         tail = tail->next;
      }
   }

   fr.prev_link = best;
   fr.x = best_x;
   fr.y = best_y;
   return fr;
}